

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_parse.c
# Opt level: O1

void l2_absorb_formal_param_list(void)

{
  l2_token *plVar1;
  
  plVar1 = l2_token_stream_next_token(g_parser_p->token_stream_p);
  l2_token_stream_rollback(g_parser_p->token_stream_p);
  if (plVar1->type == L2_TOKEN_IDENTIFIER) {
    l2_token_stream_next_token(g_parser_p->token_stream_p);
    l2_absorb_formal_param_list1();
    return;
  }
  return;
}

Assistant:

boolean l2_parse_probe_next_token_by_type(l2_token_type type) {
    l2_token *t = l2_token_stream_next_token(g_parser_p->token_stream_p);
    l2_token_stream_rollback(g_parser_p->token_stream_p);
    return t->type == type;
}